

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy.c
# Opt level: O0

xmlChar * htmlDecodeEntities(htmlParserCtxtPtr ctxt,int len,xmlChar end,xmlChar end2,xmlChar end3)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlChar end3_local;
  xmlChar end2_local;
  xmlChar end_local;
  int len_local;
  htmlParserCtxtPtr ctxt_local;
  
  if (htmlDecodeEntities::deprecated == 0) {
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"htmlDecodeEntities() deprecated function reached\n");
    htmlDecodeEntities::deprecated = 1;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
htmlDecodeEntities(htmlParserCtxtPtr ctxt ATTRIBUTE_UNUSED,
                   int len ATTRIBUTE_UNUSED, xmlChar end ATTRIBUTE_UNUSED,
                   xmlChar end2 ATTRIBUTE_UNUSED,
                   xmlChar end3 ATTRIBUTE_UNUSED)
{
    static int deprecated = 0;

    if (!deprecated) {
        xmlGenericError(xmlGenericErrorContext,
                        "htmlDecodeEntities() deprecated function reached\n");
        deprecated = 1;
    }
    return (NULL);
}